

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Install
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmake *this_00;
  pointer pcVar2;
  _Alloc_hider _Var3;
  pointer pcVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  string *psVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *pcVar9;
  char *pcVar10;
  undefined4 extraout_var_05;
  cmMakefile *pcVar11;
  long lVar12;
  undefined1 auVar13 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar14;
  string cfgArg;
  cmCustomCommandLine localCmdLine;
  cmCustomCommandLine singleLine;
  cmCustomCommandLine stripCmdLine;
  string cmd;
  GlobalTargetInfo gti;
  string local_2f0;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *local_2d0;
  string local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  cmMakefile *local_288;
  char *local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  undefined1 local_260 [32];
  _Alloc_hider local_240;
  size_type local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_208;
  _Alloc_hider local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  bool local_1d0;
  string local_1c8;
  undefined1 local_1a8 [8];
  char *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  char *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_150;
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  bool local_118;
  undefined4 extraout_var_04;
  
  pcVar11 = *(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_2d0 = targets;
  iVar7 = (*this->_vptr_cmGlobalGenerator[0x13])();
  pcVar9 = (char *)CONCAT44(extraout_var,iVar7);
  local_1a8 = (undefined1  [8])&local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_SKIP_INSTALL_RULES","")
  ;
  bVar6 = cmMakefile::IsOn(pcVar11,(string *)local_1a8);
  if (local_1a8 != (undefined1  [8])&local_198) {
    operator_delete((void *)local_1a8,
                    CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1);
  }
  if ((bVar6 & this->InstallTargetEnabled) == 1) {
    this_00 = this->CMakeInstance;
    local_1a8 = (undefined1  [8])&local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "CMAKE_SKIP_INSTALL_RULES was enabled even though installation rules have been specified"
               ,"");
    cmMakefile::GetBacktrace(pcVar11);
    cmake::IssueMessage(this_00,WARNING,(string *)local_1a8,(cmListFileBacktrace *)local_260);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._8_8_);
    }
    if (local_1a8 == (undefined1  [8])&local_198) {
      return;
    }
    lVar12 = CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]);
    auVar13 = local_1a8;
  }
  else {
    if (bVar6 || this->InstallTargetEnabled != true) {
      return;
    }
    local_288 = pcVar11;
    if (((pcVar9 == (char *)0x0) || (*pcVar9 == '.')) || (*pcVar9 == '\0')) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      if ((this->InstallComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Only default component available",0x20);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Available install components are: ",0x22);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0," ","");
        cmWrap<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                  ((string *)local_260,'\"',&this->InstallComponents,'\"',&local_2f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)local_260._0_8_,local_260._8_8_);
        if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
          operator_delete((void *)local_260._0_8_,CONCAT71(local_260._17_7_,local_260[0x10]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
      }
      local_260._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_260[0x10] = '\0';
      local_238 = 0;
      local_230._M_local_buf[0] = '\0';
      local_220.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_220.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_220.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_208.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_208.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_208.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1e8 = 0;
      local_1e0._M_local_buf[0] = '\0';
      local_1d0 = false;
      local_260._0_8_ = local_260 + 0x10;
      local_240._M_p = local_260 + 0x30;
      local_1f0._M_p = local_260 + 0x80;
      std::__cxx11::string::_M_replace((ulong)local_260,0,(char *)0x0,0x506feb);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)(local_260 + 0x20),(string *)&local_2f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      local_1d0 = false;
      std::
      vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
      ::emplace_back<cmGlobalGenerator::GlobalTargetInfo>(local_2d0,(GlobalTargetInfo *)local_260);
      if (local_1f0._M_p != local_260 + 0x80) {
        operator_delete(local_1f0._M_p,
                        CONCAT71(local_1e0._M_allocated_capacity._1_7_,local_1e0._M_local_buf[0]) +
                        1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_260 + 0x58));
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                 (local_260 + 0x40));
      if (local_240._M_p != local_260 + 0x30) {
        operator_delete(local_240._M_p,
                        CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) +
                        1);
      }
      if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
        operator_delete((void *)local_260._0_8_,CONCAT71(local_260._17_7_,local_260[0x10]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)&local_138);
    }
    local_280 = pcVar9;
    psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    local_260._0_8_ = local_260 + 0x10;
    pcVar2 = (psVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_260,pcVar2,pcVar2 + psVar8->_M_string_length);
    local_188._M_p = (pointer)&local_178;
    local_1a0 = (char *)0x0;
    local_198._M_local_buf[0] = '\0';
    local_180 = (char *)0x0;
    local_178._M_local_buf[0] = '\0';
    local_138._M_p = (pointer)&local_128;
    local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_150.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_150.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_150.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    local_118 = false;
    local_1a8 = (undefined1  [8])&local_198;
    iVar7 = (*this->_vptr_cmGlobalGenerator[0x18])(this);
    pcVar9 = local_1a0;
    strlen((char *)CONCAT44(extraout_var_00,iVar7));
    std::__cxx11::string::_M_replace((ulong)local_1a8,0,pcVar9,CONCAT44(extraout_var_00,iVar7));
    std::__cxx11::string::_M_replace((ulong)&local_188,0,local_180,0x507003);
    local_118 = true;
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar7 = (*this->_vptr_cmGlobalGenerator[0x1b])(this);
    pcVar11 = local_288;
    paVar1 = &local_2f0.field_2;
    if (CONCAT44(extraout_var_01,iVar7) == 0) {
      local_2f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f0,"CMAKE_SKIP_INSTALL_ALL_DEPENDENCY","");
      pcVar9 = cmMakefile::GetDefinition(pcVar11,&local_2f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((pcVar9 == (char *)0x0) || (bVar6 = cmSystemTools::IsOff(pcVar9), bVar6)) {
        iVar7 = (*this->_vptr_cmGlobalGenerator[0x17])(this);
        local_2f0._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_03,iVar7);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vStack_150,
                   (char **)&local_2f0);
      }
    }
    else {
      iVar7 = (*this->_vptr_cmGlobalGenerator[0x1b])(this);
      local_2f0._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_02,iVar7);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vStack_150,
                 (char **)&local_2f0);
    }
    local_2f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CMake_BINARY_DIR","");
    pcVar9 = cmMakefile::GetDefinition(pcVar11,&local_2f0);
    if (pcVar9 == (char *)0x0) {
      bVar6 = false;
    }
    else {
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c8,"CMAKE_CROSSCOMPILING","");
      bVar6 = cmMakefile::IsOn(pcVar11,&local_1c8);
      bVar6 = !bVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      std::__cxx11::string::_M_replace((ulong)local_260,0,(char *)local_260._8_8_,0x4fd7c4);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_2a8,(value_type *)local_260);
    if (((local_280 != (char *)0x0) && (*local_280 != '\0')) && (*local_280 != '.')) {
      local_2f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"-DBUILD_TYPE=","");
      iVar7 = (*this->_vptr_cmGlobalGenerator[0x29])(this,pcVar11);
      if ((char)iVar7 == '\0') {
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"CMAKE_CFG_INTDIR","");
        cmMakefile::GetDefinition(pcVar11,&local_2c8);
        std::__cxx11::string::append((char *)&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::append((char *)&local_2f0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_2a8,&local_2f0);
        std::__cxx11::string::_M_replace
                  ((ulong)&local_2f0,0,(char *)local_2f0._M_string_length,0x50706c);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_2a8,&local_2f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
    }
    local_2f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"-P","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8,
               &local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    local_2f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"cmake_install.cmake","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8,
               &local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&local_168,(value_type *)&local_2a8);
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::push_back(local_2d0,(value_type *)local_1a8);
    iVar7 = (*this->_vptr_cmGlobalGenerator[0x19])(this);
    pcVar9 = local_1a0;
    pcVar10 = (char *)CONCAT44(extraout_var_04,iVar7);
    if (pcVar10 != (char *)0x0) {
      strlen(pcVar10);
      std::__cxx11::string::_M_replace((ulong)local_1a8,0,pcVar9,(ulong)pcVar10);
      std::__cxx11::string::_M_replace((ulong)&local_188,0,local_180,0x5070a1);
      pcVar5 = local_168.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pcVar4 = local_168.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start;
      local_118 = true;
      pvVar14 = &(local_168.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_start)->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      if (local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(pvVar14);
          pvVar14 = pvVar14 + 1;
        } while (pvVar14 !=
                 &pcVar5->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
        local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        _M_impl.super__Vector_impl_data._M_finish = pcVar4;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2c8,&local_2a8);
      _Var3._M_p = local_2c8._M_dataplus._M_p;
      local_2f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f0,"-DCMAKE_INSTALL_LOCAL_ONLY=1","");
      pcVar11 = local_288;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_2c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (_Var3._M_p + 0x20),&local_2f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
      emplace_back<cmCustomCommandLine>(&local_168,(cmCustomCommandLine *)&local_2c8);
      std::
      vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
      ::push_back(local_2d0,(value_type *)local_1a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2c8);
    }
    iVar7 = (*this->_vptr_cmGlobalGenerator[0x1a])(this);
    pcVar9 = (char *)CONCAT44(extraout_var_05,iVar7);
    if (pcVar9 == (char *)0x0) {
      bVar6 = false;
    }
    else {
      local_2f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CMAKE_STRIP","");
      bVar6 = cmMakefile::IsSet(pcVar11,&local_2f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar10 = local_1a0;
    if (bVar6 != false) {
      strlen(pcVar9);
      std::__cxx11::string::_M_replace((ulong)local_1a8,0,pcVar10,(ulong)pcVar9);
      std::__cxx11::string::_M_replace((ulong)&local_188,0,local_180,0x5070f1);
      pcVar5 = local_168.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pcVar4 = local_168.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start;
      local_118 = true;
      pvVar14 = &(local_168.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_start)->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      if (local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(pvVar14);
          pvVar14 = pvVar14 + 1;
        } while (pvVar14 !=
                 &pcVar5->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
        local_168.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        _M_impl.super__Vector_impl_data._M_finish = pcVar4;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_278,&local_2a8);
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c8,"-DCMAKE_INSTALL_DO_STRIP=1","");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&local_278,
                       local_278.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,&local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
      emplace_back<cmCustomCommandLine>(&local_168,(cmCustomCommandLine *)&local_278);
      std::
      vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
      ::push_back(local_2d0,(value_type *)local_1a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_278);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_p != &local_128) {
      operator_delete(local_138._M_p,
                      CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) + 1)
      ;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_150);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_p != &local_178) {
      operator_delete(local_188._M_p,
                      CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]) + 1)
      ;
    }
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_260._0_8_ == local_260 + 0x10) {
      return;
    }
    lVar12 = CONCAT71(local_260._17_7_,local_260[0x10]);
    auVar13 = (undefined1  [8])local_260._0_8_;
  }
  operator_delete((void *)auVar13,lVar12 + 1);
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Install(
  std::vector<GlobalTargetInfo>& targets)
{
  cmMakefile* mf = this->Makefiles[0];
  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  bool skipInstallRules = mf->IsOn("CMAKE_SKIP_INSTALL_RULES");
  if (this->InstallTargetEnabled && skipInstallRules) {
    this->CMakeInstance->IssueMessage(
      MessageType::WARNING,
      "CMAKE_SKIP_INSTALL_RULES was enabled even though "
      "installation rules have been specified",
      mf->GetBacktrace());
  } else if (this->InstallTargetEnabled && !skipInstallRules) {
    if (!cmakeCfgIntDir || !*cmakeCfgIntDir || cmakeCfgIntDir[0] == '.') {
      std::set<std::string>* componentsSet = &this->InstallComponents;
      std::ostringstream ostr;
      if (!componentsSet->empty()) {
        ostr << "Available install components are: ";
        ostr << cmWrap('"', *componentsSet, '"', " ");
      } else {
        ostr << "Only default component available";
      }
      GlobalTargetInfo gti;
      gti.Name = "list_install_components";
      gti.Message = ostr.str();
      gti.UsesTerminal = false;
      targets.push_back(std::move(gti));
    }
    std::string cmd = cmSystemTools::GetCMakeCommand();
    GlobalTargetInfo gti;
    gti.Name = this->GetInstallTargetName();
    gti.Message = "Install the project...";
    gti.UsesTerminal = true;
    cmCustomCommandLine singleLine;
    if (this->GetPreinstallTargetName()) {
      gti.Depends.emplace_back(this->GetPreinstallTargetName());
    } else {
      const char* noall =
        mf->GetDefinition("CMAKE_SKIP_INSTALL_ALL_DEPENDENCY");
      if (!noall || cmSystemTools::IsOff(noall)) {
        gti.Depends.emplace_back(this->GetAllTargetName());
      }
    }
    if (mf->GetDefinition("CMake_BINARY_DIR") &&
        !mf->IsOn("CMAKE_CROSSCOMPILING")) {
      // We are building CMake itself.  We cannot use the original
      // executable to install over itself.  The generator will
      // automatically convert this name to the build-time location.
      cmd = "cmake";
    }
    singleLine.push_back(cmd);
    if (cmakeCfgIntDir && *cmakeCfgIntDir && cmakeCfgIntDir[0] != '.') {
      std::string cfgArg = "-DBUILD_TYPE=";
      bool useEPN = this->UseEffectivePlatformName(mf);
      if (useEPN) {
        cfgArg += "$(CONFIGURATION)";
        singleLine.push_back(cfgArg);
        cfgArg = "-DEFFECTIVE_PLATFORM_NAME=$(EFFECTIVE_PLATFORM_NAME)";
      } else {
        cfgArg += mf->GetDefinition("CMAKE_CFG_INTDIR");
      }
      singleLine.push_back(cfgArg);
    }
    singleLine.push_back("-P");
    singleLine.push_back("cmake_install.cmake");
    gti.CommandLines.push_back(singleLine);
    targets.push_back(gti);

    // install_local
    if (const char* install_local = this->GetInstallLocalTargetName()) {
      gti.Name = install_local;
      gti.Message = "Installing only the local directory...";
      gti.UsesTerminal = true;
      gti.CommandLines.clear();

      cmCustomCommandLine localCmdLine = singleLine;

      localCmdLine.insert(localCmdLine.begin() + 1,
                          "-DCMAKE_INSTALL_LOCAL_ONLY=1");

      gti.CommandLines.push_back(std::move(localCmdLine));
      targets.push_back(gti);
    }

    // install_strip
    const char* install_strip = this->GetInstallStripTargetName();
    if ((install_strip != nullptr) && (mf->IsSet("CMAKE_STRIP"))) {
      gti.Name = install_strip;
      gti.Message = "Installing the project stripped...";
      gti.UsesTerminal = true;
      gti.CommandLines.clear();

      cmCustomCommandLine stripCmdLine = singleLine;

      stripCmdLine.insert(stripCmdLine.begin() + 1,
                          "-DCMAKE_INSTALL_DO_STRIP=1");
      gti.CommandLines.push_back(std::move(stripCmdLine));
      targets.push_back(gti);
    }
  }
}